

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMan.c
# Opt level: O0

void Gia_ManDfsSlacksPrint(Gia_Man_t *p)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  int nTotal;
  int nRange;
  int Entry;
  int i;
  Vec_Int_t *vSlacks;
  Vec_Int_t *vCounts;
  Gia_Man_t *p_local;
  
  p_00 = Gia_ManDfsSlacks(p);
  iVar1 = Vec_IntSize(p_00);
  if (iVar1 == 0) {
    printf("Network contains no internal objects.\n");
    Vec_IntFree(p_00);
  }
  else {
    for (nRange = 0; iVar1 = Vec_IntSize(p_00), nRange < iVar1; nRange = nRange + 1) {
      iVar1 = Vec_IntEntry(p_00,nRange);
      if (iVar1 != -1) {
        Vec_IntWriteEntry(p_00,nRange,iVar1 / 10);
      }
    }
    iVar1 = Vec_IntFindMax(p_00);
    p_01 = Vec_IntStart(iVar1 + 1);
    for (nRange = 0; iVar1 = Vec_IntSize(p_00), nRange < iVar1; nRange = nRange + 1) {
      iVar1 = Vec_IntEntry(p_00,nRange);
      if (iVar1 != -1) {
        Vec_IntAddToEntry(p_01,iVar1,1);
      }
    }
    iVar1 = Vec_IntSum(p_01);
    if (iVar1 < 1) {
      __assert_fail("nTotal > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMan.c"
                    ,0x498,"void Gia_ManDfsSlacksPrint(Gia_Man_t *)");
    }
    for (nRange = 0; iVar2 = Vec_IntSize(p_01), nRange < iVar2; nRange = nRange + 1) {
      uVar3 = Vec_IntEntry(p_01,nRange);
      printf("Slack range %3d = ",(ulong)(uint)nRange);
      printf("[%4d, %4d)   ",(ulong)(uint)(nRange * 10),(ulong)(uint)((nRange + 1) * 10));
      printf("Nodes = %5d  ",(ulong)uVar3);
      printf("(%6.2f %%) ",((double)(int)uVar3 * 100.0) / (double)iVar1);
      printf("\n");
    }
    Vec_IntFree(p_00);
    Vec_IntFree(p_01);
  }
  return;
}

Assistant:

void Gia_ManDfsSlacksPrint( Gia_Man_t * p )
{
    Vec_Int_t * vCounts, * vSlacks = Gia_ManDfsSlacks( p );
    int i, Entry, nRange, nTotal;
    if ( Vec_IntSize(vSlacks) == 0 )
    {
        printf( "Network contains no internal objects.\n" );
        Vec_IntFree( vSlacks );
        return;
    }
    // compute slacks
    Vec_IntForEachEntry( vSlacks, Entry, i )
        if ( Entry != -1 )
            Vec_IntWriteEntry( vSlacks, i, Entry/10 );
    nRange = Vec_IntFindMax( vSlacks );
    // count items
    vCounts = Vec_IntStart( nRange + 1 );
    Vec_IntForEachEntry( vSlacks, Entry, i )
        if ( Entry != -1 )
            Vec_IntAddToEntry( vCounts, Entry, 1 );
    // print slack ranges
    nTotal = Vec_IntSum( vCounts );
    assert( nTotal > 0 );
    Vec_IntForEachEntry( vCounts, Entry, i )
    {
        printf( "Slack range %3d = ", i );
        printf( "[%4d, %4d)   ", 10*i, 10*(i+1) );
        printf( "Nodes = %5d  ", Entry );
        printf( "(%6.2f %%) ", 100.0*Entry/nTotal );
        printf( "\n" );
    }
    Vec_IntFree( vSlacks );
    Vec_IntFree( vCounts );
}